

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O3

void rw::conv_RGBA5551_from_ARGB1555(uint8 *out,uint8 *in)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = in[1];
  bVar2 = *in >> 5;
  *out = bVar2 << 6 | (*in & 0x1f) * '\x02' - ((char)bVar1 >> 7);
  out[1] = (char)((uint)bVar2 + (bVar1 & 3) * 8 >> 2) + (bVar1 & 0x7c) * '\x02';
  return;
}

Assistant:

void
conv_RGBA5551_from_ARGB1555(uint8 *out, uint8 *in)
{
	uint32 r, g, b, a;
	a = (in[1]>>7) & 1;
	r = (in[1]>>2) & 0x1F;
	g = (in[1]&3)<<3 | ((in[0]>>5)&7);
	b = in[0] & 0x1F;
	out[0] = a | b<<1 | g<<6;
	out[1] = g>>2 | r<<3;
}